

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

AnchorData ** __thiscall
QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::operator[]
          (QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> *this
          ,AnchorVertex **key)

{
  AnchorData **ppAVar1;
  long in_FS_OFFSET;
  AnchorVertex **in_stack_ffffffffffffffb8;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  ppAVar1 = iterator::operator*((iterator *)0x954993);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return ppAVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }